

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O3

void __thiscall
so_5::timers_details::
actual_timer_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::release(actual_timer_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
          *this)

{
  reference_counter_type *prVar1;
  basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::manager>
  *this_00;
  timer_object<timertt::thread_safety::unsafe> *ptVar2;
  timer_holder local_10;
  
  this_00 = (basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::manager>
             *)this->m_thread;
  if (this_00 !=
      (basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::manager>
       *)0x0) {
    local_10.m_timer = (this->m_timer).m_timer;
    if (local_10.m_timer != (timer_object<timertt::thread_safety::unsafe> *)0x0) {
      (local_10.m_timer)->m_references = (local_10.m_timer)->m_references + 1;
    }
    timertt::details::
    basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::manager>
    ::deactivate(this_00,&local_10);
    if (local_10.m_timer != (timer_object<timertt::thread_safety::unsafe> *)0x0) {
      prVar1 = &(local_10.m_timer)->m_references;
      *prVar1 = *prVar1 - 1;
      if (*prVar1 == 0) {
        (*(local_10.m_timer)->_vptr_timer_object[1])();
      }
      local_10.m_timer = (timer_object<timertt::thread_safety::unsafe> *)0x0;
    }
    this->m_thread =
         (timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
          *)0x0;
    ptVar2 = (this->m_timer).m_timer;
    if (ptVar2 != (timer_object<timertt::thread_safety::unsafe> *)0x0) {
      prVar1 = &ptVar2->m_references;
      *prVar1 = *prVar1 - 1;
      if (*prVar1 == 0) {
        (*ptVar2->_vptr_timer_object[1])();
      }
      (this->m_timer).m_timer = (timer_object<timertt::thread_safety::unsafe> *)0x0;
    }
  }
  return;
}

Assistant:

virtual void
		release() override
			{
				if( m_thread )
				{
					m_thread->deactivate( m_timer );
					m_thread = nullptr;
					m_timer.reset();
				}
			}